

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O2

void j1939cat_print_timestamp(j1939cat_priv *priv,char *name,timespec *cur)

{
  if (cur->tv_nsec == 0 && cur->tv_sec == 0) {
    return;
  }
  fprintf(_stderr,"  %s: %llu s %llu us (seq=%03u, send=%07u)",name,cur->tv_sec,
          (ulong)cur->tv_nsec / 1000,(ulong)(priv->stats).tskey,(priv->stats).send);
  fputc(10,_stderr);
  return;
}

Assistant:

static void j1939cat_print_timestamp(struct j1939cat_priv *priv, const char *name,
			      struct timespec *cur)
{
	struct j1939cat_stats *stats = &priv->stats;

	if (!(cur->tv_sec | cur->tv_nsec))
		return;

	fprintf(stderr, "  %s: %llu s %llu us (seq=%03u, send=%07u)",
			name, (unsigned long long)cur->tv_sec, (unsigned long long)cur->tv_nsec / 1000,
			stats->tskey, stats->send);

	fprintf(stderr, "\n");
}